

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

float If_CutEdgeRef(If_Man_t *p,If_Cut_t *pCut)

{
  int iVar1;
  If_Cut_t *pCut_00;
  bool bVar2;
  float fVar3;
  int local_28;
  float local_24;
  int i;
  float Edge;
  If_Obj_t *pLeaf;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  local_24 = (float)(byte)pCut->field_0x1f;
  local_28 = 0;
  while( true ) {
    bVar2 = false;
    if (local_28 < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
      _i = If_ManObj(p,(int)(&pCut[1].Area)[local_28]);
      bVar2 = _i != (If_Obj_t *)0x0;
    }
    if (!bVar2) break;
    if (_i->nRefs < 0) {
      __assert_fail("pLeaf->nRefs >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCut.c"
                    ,0x4a0,"float If_CutEdgeRef(If_Man_t *, If_Cut_t *)");
    }
    iVar1 = _i->nRefs;
    _i->nRefs = iVar1 + 1;
    if ((iVar1 < 1) && (iVar1 = If_ObjIsAnd(_i), iVar1 != 0)) {
      pCut_00 = If_ObjCutBest(_i);
      fVar3 = If_CutEdgeRef(p,pCut_00);
      local_24 = fVar3 + local_24;
    }
    local_28 = local_28 + 1;
  }
  return local_24;
}

Assistant:

float If_CutEdgeRef( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    float Edge;
    int i;
    Edge = pCut->nLeaves;
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        assert( pLeaf->nRefs >= 0 );
        if ( pLeaf->nRefs++ > 0 || !If_ObjIsAnd(pLeaf) )
            continue;
        Edge += If_CutEdgeRef( p, If_ObjCutBest(pLeaf) );
    }
    return Edge;
}